

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O0

int corpus_read_next_sent_file(char **trans)

{
  FILE *__stream;
  lineiter_t *li_00;
  char *pcVar1;
  lineiter_t *li;
  FILE *fp;
  char **trans_local;
  
  __stream = (FILE *)open_file_for_reading(0);
  li_00 = lineiter_start_clean((FILE *)__stream);
  if (li_00 == (lineiter_t *)0x0) {
    pcVar1 = mk_filename(0,cur_ctl_path);
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
            ,0x4fc,"Unable to read data in sent file %s\n",pcVar1);
    trans_local._4_4_ = -1;
  }
  else {
    pcVar1 = strdup(li_00->buf);
    *trans = pcVar1;
    lineiter_free(li_00);
    fclose(__stream);
    trans_local._4_4_ = 0;
  }
  return trans_local._4_4_;
}

Assistant:

static int
corpus_read_next_sent_file(char **trans)
{
    FILE *fp;
    lineiter_t *li;

    /* open the current file */
    fp = open_file_for_reading(DATA_TYPE_SENT);

    li = lineiter_start_clean(fp);
    if (li == NULL) {
	E_ERROR("Unable to read data in sent file %s\n",
		mk_filename(DATA_TYPE_SENT, cur_ctl_path));		
	return S3_ERROR;
    }

    *trans = strdup(li->buf);
    lineiter_free(li);
    fclose(fp);

    return S3_SUCCESS;
}